

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_3c4::NinjaMain::ToolRestat(NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  int output_count;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  StringPiece local_f0;
  undefined1 local_d9;
  undefined4 local_d8;
  LoadStatus LStack_d4;
  bool success;
  undefined1 local_d0 [4];
  LoadStatus status;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string log_path;
  int opt;
  char **argv_local;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  _optind = 1;
  log_path.field_2._12_4_ = getopt(argc + 1,argv + -1,"h");
  if (log_path.field_2._12_4_ == -1) {
    lVar5 = (long)_optind;
    output_count = (argc + 1) - _optind;
    bVar1 = EnsureBuildDirExists(this);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,".ninja_log",&local_59);
      std::allocator<char>::~allocator(&local_59);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err.field_2 + 8),&this->build_dir_,"/");
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        std::__cxx11::string::operator=((string *)local_58,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)(err.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)local_d0);
      LStack_d4 = BuildLog::Load(&this->build_log_,(string *)local_58,(string *)local_d0);
      if (LStack_d4 == LOAD_ERROR) {
        uVar3 = std::__cxx11::string::c_str();
        uVar4 = std::__cxx11::string::c_str();
        Error("loading build log %s: %s",uVar3,uVar4);
        this_local._4_4_ = 1;
      }
      else if (LStack_d4 == LOAD_NOT_FOUND) {
        this_local._4_4_ = 0;
      }
      else {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          uVar3 = std::__cxx11::string::c_str();
          Warning("%s",uVar3);
          std::__cxx11::string::clear();
        }
        StringPiece::StringPiece(&local_f0,(string *)local_58);
        local_d9 = BuildLog::Restat(&this->build_log_,local_f0,
                                    &(this->disk_interface_).super_DiskInterface,output_count,
                                    argv + -1 + lVar5,(string *)local_d0);
        if ((bool)local_d9) {
          if (((this->config_->dry_run & 1U) != 0) ||
             (bVar1 = BuildLog::OpenForWrite
                                (&this->build_log_,(string *)local_58,&this->super_BuildLogUser,
                                 (string *)local_d0), bVar1)) {
            this_local._4_4_ = 0;
          }
          else {
            uVar3 = std::__cxx11::string::c_str();
            Error("opening build log: %s",uVar3);
            this_local._4_4_ = 1;
          }
        }
        else {
          uVar3 = std::__cxx11::string::c_str();
          Error("failed recompaction: %s",uVar3);
          this_local._4_4_ = 1;
        }
      }
      local_d8 = 1;
      std::__cxx11::string::~string((string *)local_d0);
      std::__cxx11::string::~string((string *)local_58);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    printf("usage: ninja -t restat [outputs]\n");
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int NinjaMain::ToolRestat(const Options* options, int argc, char* argv[]) {
  // The restat tool uses getopt, and expects argv[0] to contain the name of the
  // tool, i.e. "restat"
  argc++;
  argv--;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("h"))) != -1) {
    switch (opt) {
    case 'h':
    default:
      printf("usage: ninja -t restat [outputs]\n");
      return 1;
    }
  }
  argv += optind;
  argc -= optind;

  if (!EnsureBuildDirExists())
    return 1;

  string log_path = ".ninja_log";
  if (!build_dir_.empty())
    log_path = build_dir_ + "/" + log_path;

  string err;
  const LoadStatus status = build_log_.Load(log_path, &err);
  if (status == LOAD_ERROR) {
    Error("loading build log %s: %s", log_path.c_str(), err.c_str());
    return EXIT_FAILURE;
  }
  if (status == LOAD_NOT_FOUND) {
    // Nothing to restat, ignore this
    return EXIT_SUCCESS;
  }
  if (!err.empty()) {
    // Hack: Load() can return a warning via err by returning LOAD_SUCCESS.
    Warning("%s", err.c_str());
    err.clear();
  }

  bool success = build_log_.Restat(log_path, disk_interface_, argc, argv, &err);
  if (!success) {
    Error("failed recompaction: %s", err.c_str());
    return EXIT_FAILURE;
  }

  if (!config_.dry_run) {
    if (!build_log_.OpenForWrite(log_path, *this, &err)) {
      Error("opening build log: %s", err.c_str());
      return EXIT_FAILURE;
    }
  }

  return EXIT_SUCCESS;
}